

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

void rr::anon_unknown_19::cliputil::clipTriangleTwoVertices
               (vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                *clippedEdges,ClipVolumePlane *plane,TriangleVertex *v0,TriangleVertex *clipped1,
               TriangleVertex *clipped2)

{
  double dVar1;
  int i;
  long lVar2;
  TriangleVertex *pTVar3;
  value_type *pvVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar5;
  ClipVec4 approximatedClipPoint;
  TriangleVertex mid2;
  TriangleVertex mid1;
  ClipVec4 anotherPointOnLine;
  double local_108 [5];
  double local_e0;
  value_type local_d8;
  value_type local_98;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_98.position.m_data[2] = 0.0;
  local_98.position.m_data[3] = 0.0;
  local_98.position.m_data[0] = 0.0;
  local_98.position.m_data[1] = 0.0;
  local_d8.position.m_data[2] = 0.0;
  local_d8.position.m_data[3] = 0.0;
  local_d8.position.m_data[0] = 0.0;
  local_d8.position.m_data[1] = 0.0;
  (*plane->_vptr_ClipVolumePlane[1])(plane,v0,clipped1);
  dVar1 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 1.0) {
    local_108[2] = 0.0;
    local_108[3] = 0.0;
    local_108[0] = 0.0;
    local_108[1] = 0.0;
    dVar5 = 1.0 - (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    lVar2 = 0;
    do {
      local_108[lVar2] =
           (v0->position).m_data[lVar2] * dVar5 +
           (clipped1->position).m_data[lVar2] * (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    pTVar3 = clipped1;
    if (0.5 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) &&
        (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != 0.5) {
      pTVar3 = v0;
    }
    local_58 = *(undefined4 *)(pTVar3->position).m_data;
    uStack_54 = *(undefined4 *)((long)(pTVar3->position).m_data + 4);
    uStack_50 = *(undefined4 *)((pTVar3->position).m_data + 1);
    uStack_4c = *(undefined4 *)((long)(pTVar3->position).m_data + 0xc);
    local_48 = *(undefined4 *)((pTVar3->position).m_data + 2);
    uStack_44 = *(undefined4 *)((long)(pTVar3->position).m_data + 0x14);
    uStack_40 = *(undefined4 *)((pTVar3->position).m_data + 3);
    uStack_3c = *(undefined4 *)((long)(pTVar3->position).m_data + 0x1c);
    (*plane->_vptr_ClipVolumePlane[2])(&local_98,plane,local_108);
    local_98.weight[0] = v0->weight[0] * dVar5 + clipped1->weight[0] * dVar1;
    local_98.weight[1] = v0->weight[1] * dVar5 + clipped1->weight[1] * dVar1;
    local_98.weight[2] = dVar5 * v0->weight[2] + clipped1->weight[2] * dVar1;
  }
  (*plane->_vptr_ClipVolumePlane[1])(plane,v0,clipped2);
  if ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) < 1.0) {
    local_108[2] = 0.0;
    local_108[3] = 0.0;
    local_108[0] = 0.0;
    local_108[1] = 0.0;
    local_e0 = 1.0 - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    lVar2 = 0;
    do {
      local_108[lVar2] =
           (v0->position).m_data[lVar2] * local_e0 +
           (clipped2->position).m_data[lVar2] *
           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    pTVar3 = clipped2;
    if (0.5 <= (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) &&
        (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) != 0.5) {
      pTVar3 = v0;
    }
    local_58 = *(undefined4 *)(pTVar3->position).m_data;
    uStack_54 = *(undefined4 *)((long)(pTVar3->position).m_data + 4);
    uStack_50 = *(undefined4 *)((pTVar3->position).m_data + 1);
    uStack_4c = *(undefined4 *)((long)(pTVar3->position).m_data + 0xc);
    local_48 = *(undefined4 *)((pTVar3->position).m_data + 2);
    uStack_44 = *(undefined4 *)((long)(pTVar3->position).m_data + 0x14);
    uStack_40 = *(undefined4 *)((pTVar3->position).m_data + 3);
    uStack_3c = *(undefined4 *)((long)(pTVar3->position).m_data + 0x1c);
    dVar5 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    (*plane->_vptr_ClipVolumePlane[2])(&local_d8,plane,local_108);
    local_d8.weight[0] = v0->weight[0] * local_e0 + clipped2->weight[0] * dVar5;
    local_d8.weight[1] = v0->weight[1] * local_e0 + clipped2->weight[1] * dVar5;
    local_d8.weight[2] = local_e0 * v0->weight[2] + clipped2->weight[2] * dVar5;
  }
  if ((1.0 <= dVar1) || (1.0 <= (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00))) {
    if ((1.0 <= dVar1) || ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) < 1.0)) {
      std::
      vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
      ::push_back(clippedEdges,v0);
      std::
      vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
      ::push_back(clippedEdges,clipped1);
      pvVar4 = &local_d8;
      if (dVar1 < 1.0) {
        pvVar4 = clipped2;
      }
      if ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) < 1.0) {
        clipped2 = pvVar4;
      }
    }
    else {
      std::
      vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
      ::push_back(clippedEdges,v0);
      std::
      vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
      ::push_back(clippedEdges,&local_98);
    }
  }
  else {
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,v0);
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,&local_98);
    clipped2 = &local_d8;
  }
  std::
  vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  ::push_back(clippedEdges,clipped2);
  return;
}

Assistant:

void clipTriangleTwoVertices (std::vector<TriangleVertex>& clippedEdges, const ClipVolumePlane& plane, const TriangleVertex& v0, const TriangleVertex& clipped1, const TriangleVertex& clipped2)
{
	const ClipFloat	unclippableLimit = (ClipFloat)1.0;

	// calc clip pos
	TriangleVertex	mid1;
	TriangleVertex	mid2;
	bool			unclippableVertex1 = false;
	bool			unclippableVertex2 = false;

	{
		const TriangleVertex&	inside	= v0;
		const TriangleVertex&	outside	= clipped1;
		      TriangleVertex&	middle	= mid1;

		const ClipFloat			hitDist	= plane.clipLineSegmentEnd(inside.position, outside.position);

		if (hitDist >= unclippableLimit)
		{
			// this edge cannot be clipped because the edge is really close to the volume boundary
			unclippableVertex1 = true;
		}
		else
		{
			const ClipVec4 approximatedClipPoint	= tcu::mix(inside.position, outside.position, hitDist);
			const ClipVec4 anotherPointOnLine		= (hitDist > (ClipFloat)0.5) ? (inside.position) : (outside.position);

			middle.position = plane.getLineIntersectionPoint(approximatedClipPoint, anotherPointOnLine);
			middle.weight[0] = tcu::mix(inside.weight[0], outside.weight[0], hitDist);
			middle.weight[1] = tcu::mix(inside.weight[1], outside.weight[1], hitDist);
			middle.weight[2] = tcu::mix(inside.weight[2], outside.weight[2], hitDist);
		}
	}

	{
		const TriangleVertex&	inside	= v0;
		const TriangleVertex&	outside	= clipped2;
		      TriangleVertex&	middle	= mid2;

		const ClipFloat			hitDist	= plane.clipLineSegmentEnd(inside.position, outside.position);

		if (hitDist >= unclippableLimit)
		{
			// this edge cannot be clipped because the edge is really close to the volume boundary
			unclippableVertex2 = true;
		}
		else
		{
			const ClipVec4 approximatedClipPoint	= tcu::mix(inside.position, outside.position, hitDist);
			const ClipVec4 anotherPointOnLine		= (hitDist > (ClipFloat)0.5) ? (inside.position) : (outside.position);

			middle.position = plane.getLineIntersectionPoint(approximatedClipPoint, anotherPointOnLine);
			middle.weight[0] = tcu::mix(inside.weight[0], outside.weight[0], hitDist);
			middle.weight[1] = tcu::mix(inside.weight[1], outside.weight[1], hitDist);
			middle.weight[2] = tcu::mix(inside.weight[2], outside.weight[2], hitDist);
		}
	}

	if (!unclippableVertex1 && !unclippableVertex2)
	{
		// gen triangle (v0) -> mid1 -> mid2
		clippedEdges.push_back(v0);
		clippedEdges.push_back(mid1);
		clippedEdges.push_back(mid2);
	}
	else if (!unclippableVertex1 && unclippableVertex2)
	{
		// clip just vertex 1
		clippedEdges.push_back(v0);
		clippedEdges.push_back(mid1);
		clippedEdges.push_back(clipped2);
	}
	else if (unclippableVertex1 && !unclippableVertex2)
	{
		// clip just vertex 2
		clippedEdges.push_back(v0);
		clippedEdges.push_back(clipped1);
		clippedEdges.push_back(mid2);
	}
	else
	{
		// don't modify
		clippedEdges.push_back(v0);
		clippedEdges.push_back(clipped1);
		clippedEdges.push_back(clipped2);
	}
}